

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBinaryHelperMemWithTemp2
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,
          JnHelperMethod helperMethodWithTemp)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  Lowerer *pLVar5;
  bool local_41;
  Instr *instrFirst;
  JnHelperMethod local_28;
  JnHelperMethod local_24;
  JnHelperMethod helperMethodWithTemp_local;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  local_28 = helperMethodWithTemp;
  local_24 = helperMethod;
  _helperMethodWithTemp_local = instr;
  instr_local = (Instr *)this;
  instrFirst._4_4_ = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
  bVar2 = Js::OpLayoutType::operator==((OpLayoutType *)((long)&instrFirst + 4),Reg3);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2289,
                       "(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3)"
                       ,"Expected a binary instruction...");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_41 = false;
  if ((*(ushort *)&_helperMethodWithTemp_local->field_0x36 >> 1 & 1) != 0) {
    pOVar4 = IR::Instr::GetDst(_helperMethodWithTemp_local);
    local_41 = false;
    if (pOVar4 != (Opnd *)0x0) {
      pOVar4 = IR::Instr::GetDst(_helperMethodWithTemp_local);
      instrFirst._2_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(pOVar4);
      local_41 = ValueType::HasBeenNumber((ValueType *)((long)&instrFirst + 2));
    }
  }
  if (local_41 == false) {
    this_local = (Lowerer *)LowerBinaryHelperMem(this,_helperMethodWithTemp_local,local_24);
  }
  else {
    pLVar5 = (Lowerer *)LoadHelperTemp(this,_helperMethodWithTemp_local,_helperMethodWithTemp_local)
    ;
    LowerBinaryHelperMem(this,_helperMethodWithTemp_local,local_28);
    this_local = pLVar5;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMemWithTemp2(
    IR::Instr *instr,
    IR::JnHelperMethod helperMethod,
    IR::JnHelperMethod helperMethodWithTemp
    )
{
    AssertMsg(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3, "Expected a binary instruction...");

    if (instr->dstIsTempNumber && instr->GetDst() && instr->GetDst()->GetValueType().HasBeenNumber())
    {
        IR::Instr * instrFirst = this->LoadHelperTemp(instr, instr);
        this->LowerBinaryHelperMem(instr, helperMethodWithTemp);
        return instrFirst;
    }

    return this->LowerBinaryHelperMem(instr, helperMethod);
}